

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

sqlite3_stmt * sqlite3_next_stmt(sqlite3 *pDb,sqlite3_stmt *pStmt)

{
  sqlite3_stmt *psVar1;
  
  if (pDb->mutex == (sqlite3_mutex *)0x0) {
    psVar1 = pStmt + 0x10;
    if (pStmt == (sqlite3_stmt *)0x0) {
      psVar1 = (sqlite3_stmt *)&pDb->pVdbe;
    }
    psVar1 = *(sqlite3_stmt **)psVar1;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(pDb->mutex);
    psVar1 = pStmt + 0x10;
    if (pStmt == (sqlite3_stmt *)0x0) {
      psVar1 = (sqlite3_stmt *)&pDb->pVdbe;
    }
    psVar1 = *(sqlite3_stmt **)psVar1;
    if (pDb->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(pDb->mutex);
    }
  }
  return psVar1;
}

Assistant:

SQLITE_API sqlite3_stmt *sqlite3_next_stmt(sqlite3 *pDb, sqlite3_stmt *pStmt){
  sqlite3_stmt *pNext;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(pDb) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  sqlite3_mutex_enter(pDb->mutex);
  if( pStmt==0 ){
    pNext = (sqlite3_stmt*)pDb->pVdbe;
  }else{
    pNext = (sqlite3_stmt*)((Vdbe*)pStmt)->pNext;
  }
  sqlite3_mutex_leave(pDb->mutex);
  return pNext;
}